

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

int sam_hdr_vadd(SAM_hdr *sh,char *type,__va_list_tag *ap,...)

{
  char cVar1;
  char cVar2;
  SAM_hdr_item_s *pSVar3;
  char *pcVar4;
  size_t sVar5;
  char in_AL;
  int iVar6;
  khint_t kVar7;
  uint uVar8;
  SAM_hdr_type *pSVar9;
  ulong uVar10;
  SAM_hdr_tag_s *pSVar11;
  char *pcVar12;
  SAM_hdr_tag *pSVar13;
  undefined8 in_RCX;
  undefined8 *puVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  SAM_hdr_tag *pSVar15;
  int iVar16;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  int new;
  SAM_hdr_type *local_100;
  SAM_hdr_tag *local_f8;
  char *local_f0;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar1 = *type;
  cVar2 = type[1];
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar6 = kputc_(0x40,&sh->text);
  if ((((iVar6 != -1) && (iVar6 = kputsn(type,2,&sh->text), iVar6 != -1)) &&
      (local_100 = (SAM_hdr_type *)pool_alloc(sh->type_pool), local_100 != (SAM_hdr_type *)0x0)) &&
     (kVar7 = kh_put_sam_hdr(sh->h,(int)cVar1 << 8 | (int)cVar2,&new), kVar7 != 0xffffffff)) {
    sh->h->vals[kVar7] = local_100;
    if (new == 0) {
      pSVar9 = sh->h->vals[kVar7];
      pSVar3 = pSVar9->prev;
      pSVar3->next = local_100;
      local_100->prev = pSVar3;
      pSVar9->prev = local_100;
      iVar6 = pSVar3->order + 1;
    }
    else {
      local_100->prev = local_100;
      iVar6 = 0;
      pSVar9 = local_100;
    }
    local_100->next = pSVar9;
    local_100->order = iVar6;
    args[0].overflow_arg_area = &stack0x00000008;
    uVar8 = 0x18;
    local_f8 = (SAM_hdr_tag *)&local_100->tag;
    pSVar15 = (SAM_hdr_tag *)0x0;
    local_f0 = type;
    while( true ) {
      uVar10 = (ulong)uVar8;
      if (uVar10 < 0x29) {
        puVar14 = (undefined8 *)((long)local_e8 + uVar10);
        uVar8 = uVar8 + 8;
        uVar10 = (ulong)uVar8;
      }
      else {
        puVar14 = (undefined8 *)args[0].overflow_arg_area;
        args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
      }
      pcVar12 = (char *)*puVar14;
      if (pcVar12 == (char *)0x0) {
        while( true ) {
          uVar8 = ap->gp_offset;
          if ((ulong)uVar8 < 0x29) {
            puVar14 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
            uVar8 = uVar8 + 8;
            ap->gp_offset = uVar8;
          }
          else {
            puVar14 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar14 + 1;
          }
          pcVar12 = (char *)*puVar14;
          if (pcVar12 == (char *)0x0) {
            iVar6 = kputc((int)sh,(kstring_t *)ap);
            pSVar9 = local_100;
            if (iVar6 == -1) {
              return -1;
            }
            iVar6 = sam_hdr_update_hashes(sh,(int)local_f0[1] | (int)*local_f0 << 8,local_100);
            if (iVar6 == -1) {
              return -1;
            }
            return pSVar9->order;
          }
          if (uVar8 < 0x29) {
            puVar14 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
            ap->gp_offset = uVar8 + 8;
          }
          else {
            puVar14 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar14 + 1;
          }
          pcVar4 = (char *)*puVar14;
          iVar6 = kputc_(9,&sh->text);
          if (iVar6 == -1) {
            return -1;
          }
          pSVar13 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
          if (pSVar13 == (SAM_hdr_tag *)0x0) {
            return -1;
          }
          sVar5 = (sh->text).l;
          iVar6 = kputs(pcVar12,&sh->text);
          if (iVar6 == -1) break;
          iVar6 = kputc_(0x3a,&sh->text);
          if (iVar6 == -1) {
            return -1;
          }
          iVar6 = kputs(pcVar4,&sh->text);
          if (iVar6 == -1) {
            return -1;
          }
          iVar16 = (int)sVar5;
          iVar6 = (int)(sh->text).l - iVar16;
          pSVar13->len = iVar6;
          pcVar12 = string_ndup(sh->str_pool,(sh->text).s + iVar16,(long)iVar6);
          pSVar13->str = pcVar12;
          pSVar13->next = (SAM_hdr_tag_s *)0x0;
          if (pcVar12 == (char *)0x0) {
            return -1;
          }
          if (pSVar15 == (SAM_hdr_tag *)0x0) {
            pSVar15 = local_f8;
          }
          pSVar15->next = pSVar13;
          pSVar15 = pSVar13;
        }
        return -1;
      }
      if ((uint)uVar10 < 0x29) {
        uVar8 = (uint)uVar10 + 8;
        puVar14 = (undefined8 *)((long)local_e8 + uVar10);
      }
      else {
        puVar14 = (undefined8 *)args[0].overflow_arg_area;
        args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
      }
      pcVar4 = (char *)*puVar14;
      iVar6 = kputc_(9,&sh->text);
      if ((iVar6 == -1) ||
         (pSVar11 = (SAM_hdr_tag_s *)pool_alloc(sh->tag_pool), pSVar11 == (SAM_hdr_tag_s *)0x0))
      break;
      sVar5 = (sh->text).l;
      iVar6 = kputs(pcVar12,&sh->text);
      if (iVar6 == -1) {
        return -1;
      }
      iVar6 = kputc_(0x3a,&sh->text);
      if (iVar6 == -1) {
        return -1;
      }
      iVar6 = kputs(pcVar4,&sh->text);
      if (iVar6 == -1) {
        return -1;
      }
      iVar16 = (int)sVar5;
      iVar6 = (int)(sh->text).l - iVar16;
      pSVar11->len = iVar6;
      pcVar12 = string_ndup(sh->str_pool,(sh->text).s + iVar16,(long)iVar6);
      pSVar11->str = pcVar12;
      pSVar11->next = (SAM_hdr_tag_s *)0x0;
      if (pcVar12 == (char *)0x0) {
        return -1;
      }
      if (pSVar15 == (SAM_hdr_tag *)0x0) {
        pSVar15 = local_f8;
      }
      pSVar15->next = pSVar11;
      pSVar15 = pSVar11;
    }
  }
  return -1;
}

Assistant:

int sam_hdr_vadd(SAM_hdr *sh, const char *type, va_list ap, ...) {
    va_list args;
    SAM_hdr_type *h_type;
    SAM_hdr_tag *h_tag, *last;
    int new;
    khint32_t type_i = (type[0]<<8) | type[1], k;

#if defined(HAVE_VA_COPY)
    va_list ap_local;
#endif

    if (EOF == kputc_('@', &sh->text))
	return -1;
    if (EOF == kputsn(type, 2, &sh->text))
	return -1;

    if (!(h_type = pool_alloc(sh->type_pool)))
	return -1;
    if (-1 == (k = kh_put(sam_hdr, sh->h, type_i, &new)))
	return -1;
    kh_val(sh->h, k) = h_type;

    // Form the ring, either with self or other lines of this type
    if (!new) {
	SAM_hdr_type *t = kh_val(sh->h, k), *p;
	p = t->prev;
	    
	assert(p->next = t);
	p->next = h_type;
	h_type->prev = p;

	t->prev = h_type;
	h_type->next = t;
	h_type->order = p->order + 1;
    } else {
	h_type->prev = h_type->next = h_type;
	h_type->order = 0;
    }

    last = NULL;

    // Any ... varargs
    va_start(args, ap);
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(args, char *)))
	    break;
	v = va_arg(args, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(args);

#if defined(HAVE_VA_COPY)
    va_copy(ap_local, ap);
#   define ap ap_local
#endif

    // Plus the specified va_list params
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(ap);

    if (EOF == kputc('\n', &sh->text))
	return -1;

    int itype = (type[0]<<8) | type[1];
    if (-1 == sam_hdr_update_hashes(sh, itype, h_type))
	return -1;

    return h_type->order;
}